

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

int lj_cf_setfenv(lua_State *L)

{
  lua_CFunction p_Var1;
  int32_t local_9c;
  cTValue *pcStack_98;
  int level;
  cTValue *o;
  GCtab *t;
  GCfunc *fn;
  lua_State *L_local;
  
  fn = (GCfunc *)L;
  o = (cTValue *)lj_lib_checktab(L,2);
  pcStack_98 = *(cTValue **)((long)fn + 0x20);
  if (((cTValue *)(fn->c).f <= pcStack_98) || ((int)(pcStack_98->field_4).it >> 0xf != -9)) {
    local_9c = lj_lib_checkint((lua_State *)&fn->c,1);
    if (local_9c == 0) {
      *(cTValue **)((long)fn + 0x48) = o;
      return 0;
    }
    pcStack_98 = lj_debug_frame((lua_State *)&fn->c,local_9c,&local_9c);
    if (pcStack_98 == (cTValue *)0x0) {
      lj_err_arg((lua_State *)&fn->c,1,LJ_ERR_INVLVL);
    }
    pcStack_98 = pcStack_98 + -1;
  }
  t = (GCtab *)(pcStack_98->u64 & 0x7fffffffffff);
  if (((GChead *)t)->unused1 == '\0') {
    (((GChead *)t)->env).gcptr64 = (uint64_t)o;
    if ((((ulong)o[1] & 3) != 0) && ((((GChead *)t)->marked & 4) != 0)) {
      lj_gc_barrierf((global_State *)(fn->c).env.gcptr64,(GCobj *)t,(GCobj *)o);
    }
    p_Var1 = (fn->c).f;
    (fn->c).f = p_Var1 + 8;
    *(ulong *)p_Var1 = (ulong)t | 0xfffb800000000000;
    return 1;
  }
  lj_err_caller((lua_State *)&fn->c,LJ_ERR_SETFENV);
}

Assistant:

LJLIB_CF(setfenv)
{
  GCfunc *fn;
  GCtab *t = lj_lib_checktab(L, 2);
  cTValue *o = L->base;
  if (!(o < L->top && tvisfunc(o))) {
    int level = lj_lib_checkint(L, 1);
    if (level == 0) {
      /* NOBARRIER: A thread (i.e. L) is never black. */
      setgcref(L->env, obj2gco(t));
      return 0;
    }
    o = lj_debug_frame(L, level, &level);
    if (o == NULL)
      lj_err_arg(L, 1, LJ_ERR_INVLVL);
    if (LJ_FR2) o--;
  }
  fn = &gcval(o)->fn;
  if (!isluafunc(fn))
    lj_err_caller(L, LJ_ERR_SETFENV);
  setgcref(fn->l.env, obj2gco(t));
  lj_gc_objbarrier(L, obj2gco(fn), t);
  setfuncV(L, L->top++, fn);
  return 1;
}